

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

PropertyInstance *
anon_unknown.dwarf_6a15e9::GetProperty<Assimp::PLY::PropertyInstance>
          (vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
           *props,int idx)

{
  size_type sVar1;
  DeadlyImportError *this;
  const_reference pvVar2;
  allocator local_39;
  string local_38;
  int local_14;
  vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_> *pvStack_10;
  int idx_local;
  vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_> *props_local
  ;
  
  local_14 = idx;
  pvStack_10 = props;
  sVar1 = std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
          ::size(props);
  if (sVar1 <= (ulong)(long)idx) {
    this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"Invalid .ply file: Property index is out of range.",&local_39);
    DeadlyImportError::DeadlyImportError(this,&local_38);
    __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pvVar2 = std::
           vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>::
           operator[](pvStack_10,(long)local_14);
  return pvVar2;
}

Assistant:

inline
    const T &GetProperty(const std::vector<T> &props, int idx) {
        if (static_cast<size_t>(idx) >= props.size()) {
            throw DeadlyImportError("Invalid .ply file: Property index is out of range.");
        }

        return props[idx];
    }